

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DOMNodeImpl::isDefaultNamespace(DOMNodeImpl *this,XMLCh *namespaceURI)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  DOMNodeImpl *currentNode;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var_02;
  DOMNode *pDVar9;
  long lVar10;
  DOMNodeImpl *this_00;
  byte bVar11;
  long *plVar8;
  undefined4 extraout_var_01;
  
  currentNode = (DOMNodeImpl *)this->fContainingNode;
  this_00 = currentNode;
  iVar5 = (*(code *)currentNode->fContainingNode[4]._vptr_DOMNode)();
  switch((short)iVar5) {
  case 1:
    iVar5 = (*(code *)currentNode->fContainingNode[0x17]._vptr_DOMNode)(currentNode);
    if (((short *)CONCAT44(extraout_var_00,iVar5) == (short *)0x0) ||
       (*(short *)CONCAT44(extraout_var_00,iVar5) == 0)) {
      iVar5 = (*(code *)currentNode->fContainingNode[0x16]._vptr_DOMNode)(currentNode);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_02,iVar5);
      bVar11 = 1;
      if (pXVar7 != namespaceURI) {
        if (pXVar7 == (XMLCh *)0x0 || namespaceURI == (XMLCh *)0x0) {
          if (namespaceURI == (XMLCh *)0x0) {
            if (pXVar7 == (XMLCh *)0x0) goto LAB_0027b571;
          }
          else {
            bVar11 = *namespaceURI == L'\0';
            if (!(bool)bVar11 || pXVar7 == (XMLCh *)0x0) goto LAB_0027b571;
          }
          XVar3 = *pXVar7;
LAB_0027b6cb:
          bVar11 = XVar3 == L'\0';
        }
        else {
          bVar11 = 0;
          lVar10 = 0;
          do {
            psVar1 = (short *)((long)namespaceURI + lVar10);
            if (*psVar1 == 0) {
              XVar3 = *(XMLCh *)((long)pXVar7 + lVar10);
              goto LAB_0027b6cb;
            }
            psVar2 = (short *)((long)pXVar7 + lVar10);
            lVar10 = lVar10 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      goto LAB_0027b571;
    }
    this_00 = currentNode;
    iVar5 = (*(code *)currentNode->fContainingNode[0x1a]._vptr_DOMNode)();
    if ((char)iVar5 != '\0') {
      this_00 = currentNode;
      iVar5 = (*(code *)currentNode->fContainingNode[0x33]._vptr_DOMNode)
                        (currentNode,&XMLUni::fgXMLNSURIName,&XMLUni::fgXMLNSString);
      plVar6 = (long *)CONCAT44(extraout_var_01,iVar5);
      plVar8 = plVar6;
      if (plVar6 != (long *)0x0) {
        pXVar7 = (XMLCh *)(**(code **)(*plVar6 + 0x18))(plVar6);
        this_00 = (DOMNodeImpl *)namespaceURI;
        bVar4 = XMLString::equals(namespaceURI,pXVar7);
        plVar8 = (long *)(ulong)bVar4;
      }
      bVar11 = (byte)plVar8;
      if (plVar6 != (long *)0x0) goto LAB_0027b571;
    }
  default:
    pDVar9 = getElementAncestor(this_00,(DOMNode *)currentNode);
    if (pDVar9 != (DOMNode *)0x0) {
LAB_0027b6a7:
      iVar5 = (*pDVar9->_vptr_DOMNode[0x24])(pDVar9,namespaceURI);
      return SUB41(iVar5,0);
    }
    break;
  case 2:
    iVar5 = (*this->fOwnerNode->_vptr_DOMNode[4])();
    if (iVar5 == 1) {
      iVar5 = (*this->fOwnerNode->_vptr_DOMNode[0x24])(this->fOwnerNode,namespaceURI);
      return SUB41(iVar5,0);
    }
    break;
  case 6:
  case 10:
  case 0xb:
  case 0xc:
    break;
  case 9:
    iVar5 = (*(code *)currentNode[-1].fContainingNode[0xd]._vptr_DOMNode)(currentNode + -1);
    pDVar9 = (DOMNode *)CONCAT44(extraout_var,iVar5);
    goto LAB_0027b6a7;
  }
  bVar11 = 0;
LAB_0027b571:
  return (bool)(bVar11 & 1);
}

Assistant:

bool DOMNodeImpl::isDefaultNamespace(const XMLCh* namespaceURI) const {
	const DOMNode *thisNode = getContainingNode();
    short type = thisNode->getNodeType();
    switch (type) {
    case DOMNode::ELEMENT_NODE: {
        const XMLCh *prefix = thisNode->getPrefix();

        // REVISIT: is it possible that prefix is empty string?
        if (prefix == 0 || !*prefix) {
            return XMLString::equals(namespaceURI, thisNode->getNamespaceURI());
        }

        if (thisNode->hasAttributes()) {
            DOMElement *elem = (DOMElement *)thisNode;
            DOMNode *attr = elem->getAttributeNodeNS(XMLUni::fgXMLNSURIName, XMLUni::fgXMLNSString);
            if (attr != 0) {
                const XMLCh *value = attr->getNodeValue();
                return XMLString::equals(namespaceURI, value);
            }
        }
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->isDefaultNamespace(namespaceURI);
        }

        return false;
    }
    case DOMNode::DOCUMENT_NODE:{
        return ((DOMDocument*)thisNode)->getDocumentElement()->isDefaultNamespace(namespaceURI);
    }

    case DOMNode::ENTITY_NODE :
    case DOMNode::NOTATION_NODE:
    case DOMNode::DOCUMENT_FRAGMENT_NODE:
    case DOMNode::DOCUMENT_TYPE_NODE:
        // type is unknown
        return false;
    case DOMNode::ATTRIBUTE_NODE:{
        if (fOwnerNode->getNodeType() == DOMNode::ELEMENT_NODE) {
            return fOwnerNode->isDefaultNamespace(namespaceURI);

        }
        return false;
    }
    default:{
        DOMNode *ancestor = getElementAncestor(thisNode);
        if (ancestor != 0) {
            return ancestor->isDefaultNamespace(namespaceURI);
        }
        return false;
    }

    }
}